

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall Assimp::FBX::FBXConverter::TransferDataToScene(FBXConverter *this)

{
  aiScene *paVar1;
  pointer ppaVar2;
  aiMesh *paVar3;
  pointer ppaVar4;
  aiMaterial *paVar5;
  pointer ppaVar6;
  aiAnimation *paVar7;
  pointer ppaVar8;
  aiLight *paVar9;
  pointer ppaVar10;
  aiCamera *paVar11;
  pointer ppaVar12;
  aiTexture *paVar13;
  ulong uVar14;
  aiMesh **ppaVar15;
  pointer ppaVar16;
  aiMaterial **ppaVar17;
  pointer ppaVar18;
  aiAnimation **ppaVar19;
  pointer ppaVar20;
  aiLight **ppaVar21;
  pointer ppaVar22;
  aiCamera **ppaVar23;
  pointer ppaVar24;
  aiTexture **ppaVar25;
  pointer ppaVar26;
  ulong uVar27;
  
  paVar1 = this->out;
  if (paVar1->mMeshes != (aiMesh **)0x0) {
    __assert_fail("!out->mMeshes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0xde4,"void Assimp::FBX::FBXConverter::TransferDataToScene()");
  }
  if (paVar1->mNumMeshes == 0) {
    uVar14 = (long)(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar14 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (long)uVar14) {
        uVar27 = uVar14;
      }
      ppaVar15 = (aiMesh **)operator_new__(uVar27);
      memset(ppaVar15,0,uVar27);
      paVar1->mMeshes = ppaVar15;
      this->out->mNumMeshes =
           (uint)((ulong)((long)(this->meshes).
                                super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->meshes).
                               super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
      ppaVar16 = (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppaVar2 = (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppaVar16 != ppaVar2) {
        ppaVar15 = this->out->mMeshes;
        do {
          paVar3 = *ppaVar16;
          *ppaVar16 = *ppaVar15;
          *ppaVar15 = paVar3;
          ppaVar16 = ppaVar16 + 1;
          ppaVar15 = ppaVar15 + 1;
        } while (ppaVar16 != ppaVar2);
      }
    }
    uVar14 = (long)(this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (uVar14 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (long)uVar14) {
        uVar27 = uVar14;
      }
      ppaVar17 = (aiMaterial **)operator_new__(uVar27);
      memset(ppaVar17,0,uVar27);
      this->out->mMaterials = ppaVar17;
      this->out->mNumMaterials =
           (uint)((ulong)((long)(this->materials).
                                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->materials).
                               super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
      ppaVar18 = (this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppaVar4 = (this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppaVar18 != ppaVar4) {
        ppaVar17 = this->out->mMaterials;
        do {
          paVar5 = *ppaVar18;
          *ppaVar18 = *ppaVar17;
          *ppaVar17 = paVar5;
          ppaVar18 = ppaVar18 + 1;
          ppaVar17 = ppaVar17 + 1;
        } while (ppaVar18 != ppaVar4);
      }
    }
    uVar14 = (long)(this->animations).
                   super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->animations).
                   super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar14 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (long)uVar14) {
        uVar27 = uVar14;
      }
      ppaVar19 = (aiAnimation **)operator_new__(uVar27);
      memset(ppaVar19,0,uVar27);
      this->out->mAnimations = ppaVar19;
      this->out->mNumAnimations =
           (uint)((ulong)((long)(this->animations).
                                super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->animations).
                               super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
      ppaVar20 = (this->animations).
                 super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppaVar6 = (this->animations).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppaVar20 != ppaVar6) {
        ppaVar19 = this->out->mAnimations;
        do {
          paVar7 = *ppaVar20;
          *ppaVar20 = *ppaVar19;
          *ppaVar19 = paVar7;
          ppaVar20 = ppaVar20 + 1;
          ppaVar19 = ppaVar19 + 1;
        } while (ppaVar20 != ppaVar6);
      }
    }
    uVar14 = (long)(this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar14 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (long)uVar14) {
        uVar27 = uVar14;
      }
      ppaVar21 = (aiLight **)operator_new__(uVar27);
      memset(ppaVar21,0,uVar27);
      this->out->mLights = ppaVar21;
      this->out->mNumLights =
           (uint)((ulong)((long)(this->lights).
                                super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->lights).
                               super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
      ppaVar22 = (this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppaVar8 = (this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppaVar22 != ppaVar8) {
        ppaVar21 = this->out->mLights;
        do {
          paVar9 = *ppaVar22;
          *ppaVar22 = *ppaVar21;
          *ppaVar21 = paVar9;
          ppaVar22 = ppaVar22 + 1;
          ppaVar21 = ppaVar21 + 1;
        } while (ppaVar22 != ppaVar8);
      }
    }
    uVar14 = (long)(this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (uVar14 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (long)uVar14) {
        uVar27 = uVar14;
      }
      ppaVar23 = (aiCamera **)operator_new__(uVar27);
      memset(ppaVar23,0,uVar27);
      this->out->mCameras = ppaVar23;
      this->out->mNumCameras =
           (uint)((ulong)((long)(this->cameras).
                                super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->cameras).
                               super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
      ppaVar24 = (this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppaVar10 = (this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      if (ppaVar24 != ppaVar10) {
        ppaVar23 = this->out->mCameras;
        do {
          paVar11 = *ppaVar24;
          *ppaVar24 = *ppaVar23;
          *ppaVar23 = paVar11;
          ppaVar24 = ppaVar24 + 1;
          ppaVar23 = ppaVar23 + 1;
        } while (ppaVar24 != ppaVar10);
      }
    }
    uVar14 = (long)(this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (uVar14 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (long)uVar14) {
        uVar27 = uVar14;
      }
      ppaVar25 = (aiTexture **)operator_new__(uVar27);
      memset(ppaVar25,0,uVar27);
      this->out->mTextures = ppaVar25;
      this->out->mNumTextures =
           (uint)((ulong)((long)(this->textures).
                                super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->textures).
                               super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 3);
      ppaVar26 = (this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppaVar12 = (this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (ppaVar26 != ppaVar12) {
        ppaVar25 = this->out->mTextures;
        do {
          paVar13 = *ppaVar26;
          *ppaVar26 = *ppaVar25;
          *ppaVar25 = paVar13;
          ppaVar26 = ppaVar26 + 1;
          ppaVar25 = ppaVar25 + 1;
        } while (ppaVar26 != ppaVar12);
      }
    }
    return;
  }
  __assert_fail("!out->mNumMeshes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                ,0xde5,"void Assimp::FBX::FBXConverter::TransferDataToScene()");
}

Assistant:

void FBXConverter::TransferDataToScene()
        {
            ai_assert(!out->mMeshes);
            ai_assert(!out->mNumMeshes);

            // note: the trailing () ensures initialization with NULL - not
            // many C++ users seem to know this, so pointing it out to avoid
            // confusion why this code works.

            if (meshes.size()) {
                out->mMeshes = new aiMesh*[meshes.size()]();
                out->mNumMeshes = static_cast<unsigned int>(meshes.size());

                std::swap_ranges(meshes.begin(), meshes.end(), out->mMeshes);
            }

            if (materials.size()) {
                out->mMaterials = new aiMaterial*[materials.size()]();
                out->mNumMaterials = static_cast<unsigned int>(materials.size());

                std::swap_ranges(materials.begin(), materials.end(), out->mMaterials);
            }

            if (animations.size()) {
                out->mAnimations = new aiAnimation*[animations.size()]();
                out->mNumAnimations = static_cast<unsigned int>(animations.size());

                std::swap_ranges(animations.begin(), animations.end(), out->mAnimations);
            }

            if (lights.size()) {
                out->mLights = new aiLight*[lights.size()]();
                out->mNumLights = static_cast<unsigned int>(lights.size());

                std::swap_ranges(lights.begin(), lights.end(), out->mLights);
            }

            if (cameras.size()) {
                out->mCameras = new aiCamera*[cameras.size()]();
                out->mNumCameras = static_cast<unsigned int>(cameras.size());

                std::swap_ranges(cameras.begin(), cameras.end(), out->mCameras);
            }

            if (textures.size()) {
                out->mTextures = new aiTexture*[textures.size()]();
                out->mNumTextures = static_cast<unsigned int>(textures.size());

                std::swap_ranges(textures.begin(), textures.end(), out->mTextures);
            }
        }